

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seat.hpp
# Opt level: O1

unique_ptr<seat,_std::default_delete<seat>_> __thiscall
seat::createSeat<Disabled>
          (seat *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *PriceMap)

{
  _func_int **pp_Var1;
  undefined1 local_60 [56];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *pmStack_28;
  element_type *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  Disabled::Disabled((Disabled *)local_60,PriceMap);
  pp_Var1 = (_func_int **)operator_new(0x50);
  *pp_Var1 = (_func_int *)&PTR___cxa_pure_virtual_00111c80;
  pp_Var1[1] = (_func_int *)local_60._8_8_;
  pp_Var1[2] = (_func_int *)(pp_Var1 + 4);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pp_Var1 + 2),local_60._16_8_,(pointer)(local_60._16_8_ + local_60._24_8_));
  pp_Var1[6] = (_func_int *)local_60._48_8_;
  pp_Var1[7] = (_func_int *)pmStack_28;
  pp_Var1[8] = (_func_int *)local_20;
  pp_Var1[9] = (_func_int *)local_18._M_pi;
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
    }
  }
  *pp_Var1 = (_func_int *)&PTR_initName_00111ca8;
  this->_vptr_seat = pp_Var1;
  ~seat((seat *)local_60);
  return (__uniq_ptr_data<seat,_std::default_delete<seat>,_true,_true>)
         (__uniq_ptr_data<seat,_std::default_delete<seat>,_true,_true>)this;
}

Assistant:

static std::unique_ptr<seat> createSeat(std::map<std::string, size_t> &PriceMap) // Produce new object of subclass
    {
        return std::make_unique<T>(T(PriceMap));
    }